

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O0

cf_hashtbl_t * cf_hashtbl_new(cf_size_t size,cf_hashtbl_cb_f value_cb)

{
  cf_hashtbl_t *pcVar1;
  void *pvVar2;
  cf_hashtbl_t *tbl;
  cf_size_t init_size;
  cf_hashtbl_cb_f value_cb_local;
  cf_size_t size_local;
  
  tbl = (cf_hashtbl_t *)0x8;
  size_local = (cf_size_t)calloc(1,0x20);
  pcVar1 = tbl;
  if ((long *)size_local == (long *)0x0) {
    size_local = 0;
  }
  else {
    do {
      tbl = pcVar1;
      pcVar1 = (cf_hashtbl_t *)((long)tbl * 2);
    } while (pcVar1 < size);
    *(int *)(size_local + 0x10) = (int)pcVar1 + -1;
    *(long *)(size_local + 8) = 0;
    pvVar2 = calloc(1,(long)tbl << 4);
    *(void **)size_local = pvVar2;
    *(cf_hashtbl_cb_f *)(size_local + 0x18) = value_cb;
    if (*(long *)size_local == 0) {
      free((void *)size_local);
      size_local = 0;
    }
  }
  return (cf_hashtbl_t *)size_local;
}

Assistant:

cf_hashtbl_t* cf_hashtbl_new(cf_size_t size, cf_hashtbl_cb_f value_cb) {
    cf_size_t init_size = 8;
    cf_hashtbl_t* tbl = CF_NULL_PTR;

    tbl = cf_malloc_z_native(sizeof(cf_hashtbl_t));
    if (!tbl) {
        return CF_NULL_PTR;
    }

    do { init_size <<= 1; } while (init_size < size);
    init_size -= 1;
    
    tbl->hashmsk = init_size;
    tbl->size = 0;
    tbl->table = cf_malloc_z_native(sizeof(hashtbl_node_t*) * (init_size + 1));
    tbl->callback = value_cb;
    if (!tbl->table) {
        cf_free_native(tbl);
        return CF_NULL_PTR;
    }
    return tbl;
}